

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer_test.cc
# Opt level: O0

void __thiscall AomLeb128_EncodeDecodeTest_Test::TestBody(AomLeb128_EncodeDecodeTest_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  size_t decoded_length;
  uint64_t decoded_value;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_t bytes_written;
  uint8_t write_buffer [4];
  size_t kWriteBufferSize;
  uint32_t value;
  AssertHelper *in_stack_fffffffffffffec0;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  size_t *in_stack_fffffffffffffed0;
  uint8_t *in_stack_fffffffffffffed8;
  int iVar2;
  uint64_t *value_00;
  char *in_stack_fffffffffffffee0;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffee8;
  Type in_stack_fffffffffffffeec;
  Type type;
  AssertHelper *in_stack_fffffffffffffef0;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff38;
  AssertHelper *in_stack_ffffffffffffff40;
  AssertionResult local_b0;
  size_t local_a0;
  uint64_t local_98 [3];
  undefined4 local_7c;
  AssertionResult local_78;
  uint local_64;
  undefined4 local_40;
  int local_3c;
  AssertionResult local_38;
  size_t local_28;
  uint8_t local_1c [16];
  undefined4 local_c;
  
  local_c = 0x98765;
  local_1c[4] = '\x04';
  local_1c[5] = '\0';
  local_1c[6] = '\0';
  local_1c[7] = '\0';
  local_1c[8] = '\0';
  local_1c[9] = '\0';
  local_1c[10] = '\0';
  local_1c[0xb] = '\0';
  local_1c[0] = '\0';
  local_1c[1] = '\0';
  local_1c[2] = '\0';
  local_1c[3] = '\0';
  local_28 = 0;
  local_3c = aom_uleb_encode(CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                             (size_t)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                             in_stack_fffffffffffffed0);
  local_40 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
             (int *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
             (int *)in_stack_fffffffffffffec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_38);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffef0);
    testing::AssertionResult::failure_message((AssertionResult *)0x3ae3d2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(char *)in_stack_fffffffffffffed0);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff40,(Message *)in_stack_ffffffffffffff38._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffec0);
    testing::Message::~Message((Message *)0x3ae42f);
  }
  local_64 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ae49d);
  if (local_64 == 0) {
    local_7c = 3;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((char *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
               (uint *)in_stack_fffffffffffffec0);
    iVar2 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffef0);
      in_stack_fffffffffffffef0 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x3ae550);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0,iVar2
                 ,(char *)in_stack_fffffffffffffed0);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff40,(Message *)in_stack_ffffffffffffff38._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffec0);
      testing::Message::~Message((Message *)0x3ae5ad);
    }
    local_64 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ae61b);
    if (local_64 == 0) {
      value_00 = local_98;
      aom_uleb_decode(local_1c,local_28,value_00,&local_a0);
      this_01 = &local_b0;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                ((char *)value_00,(char *)in_stack_fffffffffffffed0,
                 (uint *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                 (unsigned_long *)in_stack_fffffffffffffec0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
      type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeec);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffef0);
        in_stack_fffffffffffffed0 =
             (size_t *)testing::AssertionResult::failure_message((AssertionResult *)0x3ae6ea);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffef0,type,&this_01->success_,(int)((ulong)value_00 >> 0x20),
                   (char *)in_stack_fffffffffffffed0);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff40,(Message *)in_stack_ffffffffffffff38._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffec0);
        testing::Message::~Message((Message *)0x3ae747);
      }
      local_64 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ae7b2);
      if (local_64 == 0) {
        this_00 = (AssertionResult *)&stack0xffffffffffffff30;
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((char *)value_00,(char *)in_stack_fffffffffffffed0,
                   (unsigned_long *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                   (unsigned_long *)this_00);
        iVar2 = (int)((ulong)value_00 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffef0);
          testing::AssertionResult::failure_message((AssertionResult *)0x3ae851);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffef0,type,&this_01->success_,iVar2,
                     (char *)in_stack_fffffffffffffed0);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff40,(Message *)in_stack_ffffffffffffff38._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          testing::Message::~Message((Message *)0x3ae89d);
        }
        local_64 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ae8ff);
      }
    }
  }
  return;
}

Assistant:

TEST(AomLeb128, EncodeDecodeTest) {
  const uint32_t value = 0x98765;  // 624485
  const size_t kWriteBufferSize = 4;
  uint8_t write_buffer[kWriteBufferSize] = { 0 };
  size_t bytes_written = 0;
  ASSERT_EQ(aom_uleb_encode(value, kWriteBufferSize, &write_buffer[0],
                            &bytes_written),
            0);
  ASSERT_EQ(bytes_written, 3u);
  uint64_t decoded_value;
  size_t decoded_length;
  aom_uleb_decode(&write_buffer[0], bytes_written, &decoded_value,
                  &decoded_length);
  ASSERT_EQ(value, decoded_value);
  ASSERT_EQ(bytes_written, decoded_length);
}